

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void a__GLAttribsBind(AGLAttribute *attribs,int nattribs)

{
  int iVar1;
  GLenum GVar2;
  AGLAttribute *__src;
  GLuint local_3c;
  GLenum glerror_3;
  GLenum glerror_2;
  GLenum glerror_1;
  GLenum glerror;
  GLint buffer;
  GLint loc;
  AGLAttribute *a;
  int i;
  int nattribs_local;
  AGLAttribute *attribs_local;
  
  a__gl_state.attribs_serial = a__gl_state.attribs_serial + 1;
  a._0_4_ = 0;
  do {
    if (nattribs <= (int)a) {
      a._0_4_ = 0;
      do {
        if (7 < (int)a) {
          return;
        }
        if ((-1 < a__gl_state.attribs[(int)a].buffer) &&
           (a__gl_state.attribs[(int)a].serial != a__gl_state.attribs_serial)) {
          glDisableVertexAttribArray((int)a);
          GVar2 = glGetError();
          if (GVar2 != 0) {
            a__GlPrintError("/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1282: glDisableVertexAttribArray(i) returned "
                            ,GVar2);
            abort();
          }
          a__gl_state.attribs[(int)a].buffer = -1;
        }
        a._0_4_ = (int)a + 1;
      } while( true );
    }
    __src = attribs + (int)a;
    iVar1 = (__src->_).location;
    if (__src->buffer == (AGLBuffer *)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = __src->buffer->name;
    }
    if (-1 < iVar1) {
      if (a__gl_state.attribs[iVar1].buffer < 0) {
        glEnableVertexAttribArray(iVar1);
        GVar2 = glGetError();
        if (GVar2 != 0) {
          a__GlPrintError("/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1265: glEnableVertexAttribArray(loc) returned "
                          ,GVar2);
          abort();
        }
      }
      if (a__gl_state.attribs[iVar1].buffer != local_3c) {
        glBindBuffer(0x8892,local_3c);
        GVar2 = glGetError();
        if (GVar2 != 0) {
          a__GlPrintError("/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1267: glBindBuffer(GL_ARRAY_BUFFER, buffer) returned "
                          ,GVar2);
          abort();
        }
        a__gl_state.attribs[iVar1].buffer = local_3c;
      }
      a__gl_state.attribs[iVar1].serial = a__gl_state.attribs_serial;
      if ((((a__gl_state.attribs[iVar1].attrib.size != __src->size) ||
           (a__gl_state.attribs[iVar1].attrib.type != __src->type)) ||
          (a__gl_state.attribs[iVar1].attrib.normalized != __src->normalized)) ||
         ((a__gl_state.attribs[iVar1].attrib.stride != __src->stride ||
          (a__gl_state.attribs[iVar1].attrib.ptr != __src->ptr)))) {
        glVertexAttribPointer
                  (iVar1,__src->size,__src->type,__src->normalized,__src->stride,__src->ptr);
        GVar2 = glGetError();
        if (GVar2 != 0) {
          a__GlPrintError("/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1275: glVertexAttribPointer(loc, a->size, a->type, a->normalized, a->stride, a->ptr) returned "
                          ,GVar2);
          abort();
        }
        memcpy(&a__gl_state.attribs[iVar1].attrib,__src,0x30);
      }
    }
    a._0_4_ = (int)a + 1;
  } while( true );
}

Assistant:

static void a__GLAttribsBind(const AGLAttribute *attribs, int nattribs) {
	ATTO_GL_PROFILE_START
	int i;
	++a__gl_state.attribs_serial;
	for (i = 0; i < nattribs; ++i) {
		const AGLAttribute *a = attribs + i;
		const GLint loc = a->_.location;
		GLint buffer = a->buffer ? a->buffer->name : 0;
		if (loc < 0) { /*AGL_PRINTFLN("Skipping %s", a->name);*/
			continue;
		}
		if (loc >= ATTO_GL_MAX_ATTRIBS) {
			ATTO_ASSERT("Attrib location is too large");
		}
		if (a__gl_state.attribs[loc].buffer < 0)
			AGL__CALL(glEnableVertexAttribArray(loc));
		if (a__gl_state.attribs[loc].buffer != buffer) {
			AGL__CALL(glBindBuffer(GL_ARRAY_BUFFER, buffer));
			a__gl_state.attribs[loc].buffer = buffer;
		}

		a__gl_state.attribs[loc].serial = a__gl_state.attribs_serial;
		if (a__gl_state.attribs[loc].attrib.size != a->size || a__gl_state.attribs[loc].attrib.type != a->type ||
			a__gl_state.attribs[loc].attrib.normalized != a->normalized ||
			a__gl_state.attribs[loc].attrib.stride != a->stride || a__gl_state.attribs[loc].attrib.ptr != a->ptr) {
			AGL__CALL(glVertexAttribPointer(loc, a->size, a->type, a->normalized, a->stride, a->ptr));
			a__gl_state.attribs[loc].attrib = *a;
		}
	}

	for (i = 0; i < ATTO_GL_MAX_ATTRIBS; ++i) {
		if (a__gl_state.attribs[i].buffer >= 0 && a__gl_state.attribs[i].serial != a__gl_state.attribs_serial) {
			AGL__CALL(glDisableVertexAttribArray(i));
			a__gl_state.attribs[i].buffer = -1;
		}
	}
	ATTO_GL_PROFILE_END
}